

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

void json_print_templates(json_session *session,abuf_template_data *data,size_t count)

{
  size_t count_local;
  abuf_template_data *data_local;
  json_session *session_local;
  
  if ((session->empty & 1U) == 0) {
    abuf_puts(session->out,",\n");
  }
  else {
    session->empty = false;
    abuf_puts(session->out,"\n");
  }
  _add_template(session->out,false,data,count);
  return;
}

Assistant:

void
json_print_templates(struct json_session *session, struct abuf_template_data *data, size_t count) {
  if (session->empty) {
    session->empty = false;
    abuf_puts(session->out, "\n");
  }
  else {
    abuf_puts(session->out, ",\n");
  }

  _add_template(session->out, false, data, count);
}